

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# critbit.c
# Opt level: O1

void cb_free_node(void *ptr)

{
  void *__ptr;
  critbit_node *node;
  
  __ptr = (void *)((long)ptr + -1);
  if (((ulong)ptr & 1) == 0) {
    cb_free_node(*ptr);
    cb_free_node(*(void **)((long)ptr + 8));
    __ptr = ptr;
  }
  free(__ptr);
  return;
}

Assistant:

static void cb_free_node(void * ptr)
{
    if (decode_pointer(&ptr) == INTERNAL_NODE) {
        struct critbit_node * node = (struct critbit_node *)ptr;
        cb_free_node(node->child[0]);
        cb_free_node(node->child[1]);
        free(node);
    }
    else {
        free(ptr);
    }
}